

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  char *pcVar1;
  _Alloc_hider *p_Var2;
  undefined8 uVar3;
  int iVar4;
  runtime_error *this;
  pointer __old_p_1;
  long lVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined8 uVar7;
  bool walk_through;
  int iVar8;
  pointer __old_p;
  char **ppcVar9;
  undefined8 uVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  Game game;
  string turns;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  _Head_base<0UL,_Player_*,_false> local_e0;
  _Head_base<0UL,_Player_*,_false> local_d8;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  vector<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
  local_a0;
  void *local_80;
  long local_70;
  long *local_68;
  long *local_60;
  string local_58;
  ulong local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_d0._12_4_ = argc + -1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f8,(long)(int)local_d0._12_4_,(allocator_type *)(local_d0 + 0x10));
  if (argc < 2) {
LAB_001043d3:
    walk_through = false;
    uVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  }
  else {
    ppcVar9 = argv + 1;
    lVar5 = 0;
    local_38 = (ulong)(uint)argc;
    do {
      __s = *ppcVar9;
      pcVar1 = *(char **)((long)&(local_f8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                         lVar5);
      p_Var2 = &(local_f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus;
      strlen(__s);
      std::__cxx11::string::_M_replace((long)&p_Var2->_M_p + lVar5,0,pcVar1,(ulong)__s);
      ppcVar9 = ppcVar9 + 1;
      lVar5 = lVar5 + 0x20;
    } while ((ulong)(uint)argc * 0x20 + -0x20 != lVar5);
    iVar8 = 0;
    if ((int)local_38 < 2) goto LAB_001043d3;
    walk_through = false;
    uVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    do {
      iVar4 = std::__cxx11::string::compare
                        ((char *)(local_f8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + iVar8));
      if (iVar4 == 0) {
        create_player((string *)(local_d0 + 0x10));
        uVar7 = local_c0._M_allocated_capacity;
        local_c0._M_allocated_capacity = 0;
        if ((paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0) &&
           ((**(code **)(paVar6->_M_allocated_capacity + 8))(paVar6),
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_c0._M_allocated_capacity !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0)) {
          (**(code **)(*local_c0._M_allocated_capacity + 8))();
        }
        iVar8 = iVar8 + 1;
      }
      else {
        iVar4 = std::__cxx11::string::compare
                          ((char *)(local_f8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + iVar8));
        uVar7 = paVar6;
        if (iVar4 == 0) {
          create_player((string *)(local_d0 + 0x10));
          uVar3 = local_c0._M_allocated_capacity;
          local_c0._M_allocated_capacity = 0;
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)uVar10 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) &&
             ((**(code **)(*(size_type *)uVar10 + 8))(uVar10),
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_c0._M_allocated_capacity !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0)) {
            (**(code **)(*local_c0._M_allocated_capacity + 8))();
          }
          iVar8 = iVar8 + 1;
          uVar10 = uVar3;
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)(local_f8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + iVar8));
          if (iVar4 == 0) {
            std::__cxx11::string::_M_assign((string *)&local_58);
            iVar8 = iVar8 + 1;
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)(local_f8.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + iVar8));
            walk_through = true;
            if (iVar4 != 0) {
              iVar4 = std::__cxx11::string::compare
                                ((char *)(local_f8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + iVar8));
              if ((iVar4 != 0) &&
                 (iVar4 = std::__cxx11::string::compare
                                    ((char *)(local_f8.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + iVar8)),
                 iVar4 != 0)) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_d0 + 0x10),"Unknown argument ",
                               local_f8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + iVar8);
                std::runtime_error::runtime_error(this,(string *)(local_d0 + 0x10));
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "Usage: chess [--white (local|client|server)[:IP:PORT]] [--black (local|client|server)[:IP:PORT]]"
                         ,0x60);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," [--turns [e2e4 ...]] [--walk-through]",0x26);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
              std::ostream::put('h');
              std::ostream::flush();
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)uVar10 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (**(code **)(*(size_type *)uVar10 + 8))(uVar10);
              }
              if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0) {
                (**(code **)(paVar6->_M_allocated_capacity + 8))(paVar6);
              }
              goto LAB_0010455e;
            }
          }
        }
      }
      iVar8 = iVar8 + 1;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)uVar7;
    } while (iVar8 < (int)local_d0._12_4_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar7 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_00104425;
  }
  local_c0._M_allocated_capacity = (size_type)&local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_d0 + 0x10),"local","");
  create_player((string *)local_d0);
  uVar7 = local_d0._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_allocated_capacity != &local_b0) {
    operator_delete((void *)local_c0._M_allocated_capacity,local_b0._M_allocated_capacity + 1);
  }
LAB_00104425:
  local_e0._M_head_impl = (Player *)uVar10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_c0._M_allocated_capacity = (size_type)&local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_d0 + 0x10),"local","");
    create_player((string *)local_d0);
    local_e0._M_head_impl = (Player *)local_d0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_allocated_capacity != &local_b0) {
      operator_delete((void *)local_c0._M_allocated_capacity,local_b0._M_allocated_capacity + 1);
    }
  }
  local_d8._M_head_impl = (Player *)uVar7;
  Game::Game((Game *)(local_d0 + 0x10),(unique_ptr<Player,_std::default_delete<Player>_> *)&local_d8
             ,(unique_ptr<Player,_std::default_delete<Player>_> *)&local_e0,walk_through,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_head_impl !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(local_e0._M_head_impl)->_vptr_Player)->_M_allocated_capacity + 8))();
  }
  local_e0._M_head_impl = (Player *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_head_impl !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(local_d8._M_head_impl)->_vptr_Player)->_M_allocated_capacity + 8))();
  }
  local_d8._M_head_impl = (Player *)0x0;
  Game::play_game((Game *)(local_d0 + 0x10));
  if (local_60 != (long *)0x0) {
    (**(code **)(*local_60 + 8))();
  }
  local_60 = (long *)0x0;
  if (local_68 != (long *)0x0) {
    (**(code **)(*local_68 + 8))();
  }
  local_68 = (long *)0x0;
  if (local_80 != (void *)0x0) {
    operator_delete(local_80,local_70 - (long)local_80);
  }
  std::
  vector<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
  ::~vector(&local_a0);
  if ((void *)local_c0._8_8_ != (void *)0x0) {
    operator_delete((void *)local_c0._8_8_,local_b0._8_8_ - local_c0._8_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
LAB_0010455e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    // Set default game settings.
    bool walk_through = false;
    string turns;
    unique_ptr<Player> white;
    unique_ptr<Player> black;

    // Parse arguments.
    vector<string> arguments(argc - 1);
    for (int i = 1; i < argc; i++) {
        arguments[i - 1] = argv[i];
    }
    for (int index = 0; index < argc - 1; index++) {
        if (arguments[index] == "--white") {
            // White player definition.
            white = create_player(arguments[index + 1]);
            index++;
        } else if (arguments[index] == "--black") {
            // Black player definition.
            black = create_player(arguments[index + 1]);
            index++;
        } else if (arguments[index] == "--turns") {
            // Pre turns definition.
            turns = arguments[index + 1];
            index++;
        } else if (arguments[index] == "--walk-through") {
            // Walk through pre turns.
            walk_through = true;
        } else if ((arguments[index] == "-h") || (arguments[index] == "--help")) {
            // Display help.
            cout << "Usage: chess [--white (local|client|server)[:IP:PORT]] [--black (local|client|server)[:IP:PORT]]"
                 << " [--turns [e2e4 ...]] [--walk-through]" << endl;
            return 0;
        } else {
            // Unknown argument.
            throw runtime_error("Unknown argument " + arguments[index]);
        }
    }

    // Fallback default players if not specified.
    if (white == nullptr) {
        white = create_player("local");
    }
    if (black == nullptr) {
        black = create_player("local");
    }

    // Initialize the game.
    Game game(move(white), move(black), walk_through, turns);

    // Play.
    game.play_game();

    return 0;
}